

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

void __thiscall
pbrt::PMJ02BNSampler::PMJ02BNSampler
          (PMJ02BNSampler *this,int samplesPerPixel,int seed,Allocator alloc)

{
  Point2<float> PVar1;
  Point2<float> *pPVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  Point2f PVar11;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  float fVar13;
  int vb;
  value_type va;
  vector<int,_std::allocator<int>_> nStored;
  Allocator alloc_local;
  int nPixelSamples;
  
  this->samplesPerPixel = samplesPerPixel;
  this->seed = seed;
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  iVar10 = 1 << (~LZCOUNT(samplesPerPixel) & 0x1eU);
  alloc_local.memoryResource = alloc.memoryResource;
  if (iVar10 != samplesPerPixel) {
    Warning<>(
             "PMJ02BNSampler results are best with power-of-4 samples per pixel (1, 4, 16, 64, ...)"
             );
  }
  if (0x10000 < samplesPerPixel) {
    Error<int_const&>("PMJ02BNSampler only supports up to %d samples per pixel",&nPMJ02bnSamples);
  }
  iVar6 = 4 << (~LZCOUNT(samplesPerPixel) & 0x1eU);
  if (iVar10 == samplesPerPixel) {
    iVar6 = samplesPerPixel;
  }
  uVar4 = (uint)(byte)(((byte)((uint)LZCOUNT(iVar6) >> 1) ^ 0xf0) + 9);
  iVar6 = 1 << (uVar4 & 0x1f);
  this->pixelTileSize = iVar6;
  nPixelSamples = (iVar6 << (uVar4 & 0x1f)) * samplesPerPixel;
  pvVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pstd::vector<pbrt::Point2<float>,pstd::pmr::polymorphic_allocator<pbrt::Point2<float>>>,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&nPixelSamples,&alloc_local);
  this->pixelSamples = pvVar5;
  va = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&nStored,(ulong)(uint)(this->pixelTileSize * this->pixelTileSize),&va,
             (allocator_type *)&vb);
  iVar6 = 0;
  do {
    if (iVar6 == 0x10000) {
      lVar9 = 0;
      while( true ) {
        if ((long)nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 == lVar9) {
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&nStored.super__Vector_base<int,_std::allocator<int>_>);
          return;
        }
        va = nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar9];
        vb = samplesPerPixel;
        if (va != samplesPerPixel) break;
        lVar9 = lVar9 + 1;
      }
      LogFatal<char_const(&)[11],char_const(&)[16],char_const(&)[11],int&,char_const(&)[16],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                 ,0xee,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [11])"nStored[i]",
                 (char (*) [16])"samplesPerPixel",(char (*) [11])"nStored[i]",&va,
                 (char (*) [16])"samplesPerPixel",&vb);
    }
    PVar11 = GetPMJ02BNSample(0,iVar6);
    fVar13 = (float)this->pixelTileSize;
    auVar12._0_4_ = PVar11.super_Tuple2<pbrt::Point2,_float>.x * fVar13;
    auVar12._4_4_ = PVar11.super_Tuple2<pbrt::Point2,_float>.y * fVar13;
    auVar12._8_4_ = (float)extraout_XMM0_Qb * fVar13;
    auVar12._12_4_ = (float)((ulong)extraout_XMM0_Qb >> 0x20) * fVar13;
    auVar3 = vmovshdup_avx(auVar12);
    iVar7 = (int)auVar3._0_4_ * this->pixelTileSize + (int)auVar12._0_4_;
    if (nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar7] == samplesPerPixel) {
      if (iVar10 == samplesPerPixel) {
        LogFatal<char_const(&)[29]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                   ,0xe4,"Check failed: %s",(char (*) [29])"!IsPowerOf4(samplesPerPixel)");
      }
    }
    else {
      iVar8 = iVar7 * samplesPerPixel +
              nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar7];
      pPVar2 = this->pixelSamples->ptr;
      if (((pPVar2[iVar8].super_Tuple2<pbrt::Point2,_float>.x != 0.0) ||
          (fVar13 = pPVar2[iVar8].super_Tuple2<pbrt::Point2,_float>.y, fVar13 != 0.0)) ||
         (NAN(fVar13))) {
        LogFatal<char_const(&)[47]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                   ,0xe8,"Check failed: %s",
                   (char (*) [47])"(*pixelSamples)[sampleOffset] == Point2f(0, 0)");
      }
      auVar3 = vroundps_avx(auVar12,9);
      auVar3 = vsubps_avx(auVar12,auVar3);
      PVar1.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3);
      pPVar2[iVar8].super_Tuple2<pbrt::Point2,_float> = PVar1.super_Tuple2<pbrt::Point2,_float>;
      nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [iVar7] = nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7] + 1;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

PMJ02BNSampler::PMJ02BNSampler(int samplesPerPixel, int seed, Allocator alloc)
    : samplesPerPixel(samplesPerPixel), seed(seed) {
    if (!IsPowerOf4(samplesPerPixel))
        Warning("PMJ02BNSampler results are best with power-of-4 samples per "
                "pixel (1, 4, 16, 64, ...)");
    // Get sorted pmj02bn samples for pixel samples
    if (samplesPerPixel > nPMJ02bnSamples)
        Error("PMJ02BNSampler only supports up to %d samples per pixel", nPMJ02bnSamples);
    // Compute _pixelTileSize_ for pmj02bn pixel samples and allocate _pixelSamples_
    pixelTileSize =
        1 << (Log4Int(nPMJ02bnSamples) - Log4Int(RoundUpPow4(samplesPerPixel)));
    int nPixelSamples = pixelTileSize * pixelTileSize * samplesPerPixel;
    pixelSamples = alloc.new_object<pstd::vector<Point2f>>(nPixelSamples, alloc);

    // Loop over pmj02bn samples and associate them with their pixels
    std::vector<int> nStored(pixelTileSize * pixelTileSize, 0);
    for (int i = 0; i < nPMJ02bnSamples; ++i) {
        Point2f p = GetPMJ02BNSample(0, i);
        p *= pixelTileSize;
        int pixelOffset = int(p.x) + int(p.y) * pixelTileSize;
        if (nStored[pixelOffset] == samplesPerPixel) {
            CHECK(!IsPowerOf4(samplesPerPixel));
            continue;
        }
        int sampleOffset = pixelOffset * samplesPerPixel + nStored[pixelOffset];
        CHECK((*pixelSamples)[sampleOffset] == Point2f(0, 0));
        (*pixelSamples)[sampleOffset] = Point2f(p - Floor(p));
        ++nStored[pixelOffset];
    }

    for (int i = 0; i < nStored.size(); ++i)
        CHECK_EQ(nStored[i], samplesPerPixel);
    for (int c : nStored)
        DCHECK_EQ(c, samplesPerPixel);
}